

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuTexture.cpp
# Opt level: O1

Vec4 __thiscall
tcu::Texture2DArrayView::gatherOffsets
          (Texture2DArrayView *this,Sampler *sampler,float s,float t,float r,int componentNdx,
          IVec2 (*offsets) [4])

{
  ConstPixelBufferAccess *src;
  int iVar1;
  int depth;
  int iVar2;
  undefined4 in_register_00000014;
  IVec2 (*in_R8) [4];
  float fVar3;
  Vec4 VVar4;
  
  src = *(ConstPixelBufferAccess **)&sampler->wrapR;
  fVar3 = floorf(r + 0.5);
  iVar1 = (int)fVar3;
  iVar2 = (src->m_size).m_data[2] + -1;
  if (iVar1 < iVar2) {
    iVar2 = iVar1;
  }
  depth = 0;
  if (-1 < iVar1) {
    depth = iVar2;
  }
  VVar4 = fetchGatherArray2DOffsets
                    ((tcu *)this,src,(Sampler *)CONCAT44(in_register_00000014,componentNdx),s,t,
                     depth,(int)offsets,in_R8);
  return (Vec4)VVar4.m_data;
}

Assistant:

Vec4 Texture2DArrayView::gatherOffsets (const Sampler& sampler, float s, float t, float r, int componentNdx, const IVec2 (&offsets)[4]) const
{
	return gatherArray2DOffsets(m_levels[0], sampler, s, t, selectLayer(r), componentNdx, offsets);
}